

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O1

bool __thiscall
SQVM::ARITH_OP(SQVM *this,SQUnsignedInteger op,SQObjectPtr *trg,SQObjectPtr *o1,SQObjectPtr *o2)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectType SVar3;
  ulong uVar4;
  ulong uVar5;
  SQTable *pSVar6;
  bool bVar7;
  SQTable *pSVar8;
  SQObjectType SVar9;
  uint *puVar10;
  ulong uVar11;
  ulong uVar12;
  char *s;
  SQFloat SVar13;
  double dVar14;
  SQFloat SVar15;
  float fVar16;
  
  SVar2 = (o1->super_SQObject)._type;
  SVar3 = (o2->super_SQObject)._type;
  SVar9 = SVar3 | SVar2;
  puVar10 = (uint *)(ulong)SVar9;
  if ((SVar9 == 0x5000006) || (SVar9 == OT_FLOAT)) {
    if (SVar2 == OT_INTEGER) {
      SVar13 = (SQFloat)(o1->super_SQObject)._unVal.nInteger;
    }
    else {
      SVar13 = (o1->super_SQObject)._unVal.fFloat;
    }
    if (SVar3 == OT_INTEGER) {
      SVar15 = (SQFloat)(o2->super_SQObject)._unVal.nInteger;
    }
    else {
      SVar15 = (o2->super_SQObject)._unVal.fFloat;
    }
    fVar16 = 15.0;
    switch(op) {
    case 0x25:
      dVar14 = fmod((double)SVar13,(double)SVar15);
      fVar16 = (float)dVar14;
      break;
    case 0x2a:
      fVar16 = SVar13 * SVar15;
      break;
    case 0x2b:
      fVar16 = SVar13 + SVar15;
      break;
    case 0x2d:
      fVar16 = SVar13 - SVar15;
      break;
    case 0x2f:
      fVar16 = SVar13 / SVar15;
    }
    if (((trg->super_SQObject)._type & 0x8000000) != 0) {
      pSVar1 = &(((trg->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(((trg->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
          super_SQRefCounted._vptr_SQRefCounted[2])();
      }
    }
    (trg->super_SQObject)._type = OT_FLOAT;
    (trg->super_SQObject)._unVal.pTable = (SQTable *)0x0;
    (trg->super_SQObject)._unVal.fFloat = fVar16;
  }
  else if (SVar9 == OT_INTEGER) {
    uVar11 = op - 0x25;
    uVar12 = uVar11;
    pSVar8 = (SQTable *)0xdeadbeef;
    if (uVar11 < 0xb) {
      uVar4 = (o1->super_SQObject)._unVal.nInteger;
      uVar5 = (o2->super_SQObject)._unVal.nInteger;
      puVar10 = &switchD_0012990a::switchdataD_0013ad68;
      uVar12 = (long)&switchD_0012990a::switchdataD_0013ad68 +
               (long)(int)(&switchD_0012990a::switchdataD_0013ad68)[uVar11];
      switch(uVar11) {
      case 0:
        if (uVar5 == 0) {
          s = "modulo by zero";
          goto LAB_00129a72;
        }
        puVar10 = (uint *)~uVar5;
        uVar12 = uVar4 ^ 0xffffffff80000000 | (ulong)puVar10;
        if (uVar12 == 0) {
          pSVar8 = (SQTable *)0x0;
        }
        else {
          puVar10 = (uint *)((long)uVar4 % (long)uVar5);
          pSVar8 = (SQTable *)puVar10;
        }
        break;
      case 5:
        pSVar8 = (SQTable *)(uVar5 * uVar4);
        break;
      case 6:
        pSVar8 = (SQTable *)(uVar5 + uVar4);
        break;
      case 8:
        pSVar8 = (SQTable *)(uVar4 - uVar5);
        break;
      case 10:
        if (uVar5 == 0) {
          s = "division by zero";
LAB_00129a72:
          Raise_Error(this,s);
          return false;
        }
        uVar12 = uVar4 ^ 0xffffffff80000000 | ~uVar5;
        if (uVar12 == 0) {
          s = "integer overflow";
          goto LAB_00129a72;
        }
        pSVar8 = (SQTable *)((long)uVar4 / (long)uVar5);
        puVar10 = (uint *)((long)uVar4 % (long)uVar5);
      }
    }
    if (((trg->super_SQObject)._type & 0x8000000) != 0) {
      pSVar1 = &(((trg->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        pSVar6 = (trg->super_SQObject)._unVal.pTable;
        (*(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  (pSVar6,uVar12,puVar10);
      }
    }
    (trg->super_SQObject)._type = OT_INTEGER;
    (trg->super_SQObject)._unVal.pTable = pSVar8;
  }
  else {
    if ((SVar9 & 0x10) == 0 || op != 0x2b) {
      bVar7 = ArithMetaMethod(this,op,o1,o2,trg);
    }
    else {
      bVar7 = StringCat(this,o1,o2,trg);
    }
    if (bVar7 == false) {
      return false;
    }
  }
  return true;
}

Assistant:

bool SQVM::ARITH_OP(SQUnsignedInteger op,SQObjectPtr &trg,const SQObjectPtr &o1,const SQObjectPtr &o2)
{
    SQInteger tmask = type(o1)|type(o2);
    switch(tmask) {
        case OT_INTEGER:{
            SQInteger res, i1 = _integer(o1), i2 = _integer(o2);
            switch(op) {
            case '+': res = i1 + i2; break;
            case '-': res = i1 - i2; break;
            case '/': if (i2 == 0) { Raise_Error(_SC("division by zero")); return false; }
                    else if (i2 == -1 && i1 == INT_MIN) { Raise_Error(_SC("integer overflow")); return false; }
                    res = i1 / i2;
                    break;
            case '*': res = i1 * i2; break;
            case '%': if (i2 == 0) { Raise_Error(_SC("modulo by zero")); return false; }
                    else if (i2 == -1 && i1 == INT_MIN) { res = 0; break; }
                    res = i1 % i2;
                    break;
            default: res = 0xDEADBEEF;
            }
            trg = res; }
            break;
        case (OT_FLOAT|OT_INTEGER):
        case (OT_FLOAT):{
            SQFloat res, f1 = tofloat(o1), f2 = tofloat(o2);
            switch(op) {
            case '+': res = f1 + f2; break;
            case '-': res = f1 - f2; break;
            case '/': res = f1 / f2; break;
            case '*': res = f1 * f2; break;
            case '%': res = SQFloat(fmod((double)f1,(double)f2)); break;
            default: res = 0x0f;
            }
            trg = res; }
            break;
        default:
            if(op == '+' && (tmask & _RT_STRING)){
                if(!StringCat(o1, o2, trg)) return false;
            }
            else if(!ArithMetaMethod(op,o1,o2,trg)) {
                return false;
            }
    }
    return true;
}